

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int add_fast_array_element(JSContext *ctx,JSObject *p,JSValue val,int flags)

{
  uint uVar1;
  JSProperty *pJVar2;
  JSVarRef **ppJVar3;
  int iVar4;
  uint new_len;
  
  uVar1 = (p->u).array.count;
  new_len = uVar1 + 1;
  pJVar2 = p->prop;
  if ((*(int *)((long)&pJVar2->u + 8) == 0) && (*(uint *)&pJVar2->u < new_len)) {
    if ((p->shape[1].header.ref_count & 0x8000000) == 0) {
      JS_FreeValue(ctx,val);
      iVar4 = JS_ThrowTypeErrorReadOnly(ctx,flags,0x30);
      return iVar4;
    }
    *(ulong *)&pJVar2->u = (ulong)new_len;
    (pJVar2->u).value.tag = 0;
  }
  if ((*(uint *)&p->u < new_len) && (iVar4 = expand_fast_array(ctx,p,new_len), iVar4 != 0)) {
    JS_FreeValue(ctx,val);
    return -1;
  }
  ppJVar3 = (p->u).func.var_refs;
  *(JSValueUnion *)(ppJVar3 + (ulong)uVar1 * 2) = val.u;
  ppJVar3[(ulong)uVar1 * 2 + 1] = (JSVarRef *)val.tag;
  (p->u).array.count = new_len;
  return 1;
}

Assistant:

static int add_fast_array_element(JSContext *ctx, JSObject *p,
                                  JSValue val, int flags)
{
    uint32_t new_len, array_len;
    /* extend the array by one */
    /* XXX: convert to slow array if new_len > 2^31-1 elements */
    new_len = p->u.array.count + 1;
    /* update the length if necessary. We assume that if the length is
       not an integer, then if it >= 2^31.  */
    if (likely(JS_VALUE_GET_TAG(p->prop[0].u.value) == JS_TAG_INT)) {
        array_len = JS_VALUE_GET_INT(p->prop[0].u.value);
        if (new_len > array_len) {
            if (unlikely(!(get_shape_prop(p->shape)->flags & JS_PROP_WRITABLE))) {
                JS_FreeValue(ctx, val);
                return JS_ThrowTypeErrorReadOnly(ctx, flags, JS_ATOM_length);
            }
            p->prop[0].u.value = JS_NewInt32(ctx, new_len);
        }
    }
    if (unlikely(new_len > p->u.array.u1.size)) {
        if (expand_fast_array(ctx, p, new_len)) {
            JS_FreeValue(ctx, val);
            return -1;
        }
    }
    p->u.array.u.values[new_len - 1] = val;
    p->u.array.count = new_len;
    return TRUE;
}